

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block1394.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  FILE *__stream;
  ushort uVar3;
  short sVar4;
  int iVar5;
  __uint32_t _Var6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  undefined8 uVar10;
  uint *puVar11;
  int *piVar12;
  bool bVar13;
  nodeid_t target_node;
  int nnodes;
  nodeid_t id;
  int isDebug;
  int isBroadcast;
  int isQuad1394;
  quadlet_t *data;
  quadlet_t data1;
  int size;
  nodeaddr_t addr;
  uint local_30;
  uint uStack_2c;
  nodeid_t node;
  int port;
  int nports;
  int args_found;
  int rc;
  int j;
  int i;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  _isBroadcast = &data;
  _j = argv;
  argv_local._0_4_ = argc;
  signal(2,signal_handler);
  pcVar8 = strstr(*_j,"quad1394");
  bVar13 = pcVar8 != (char *)0x0;
  bVar2 = false;
  bVar1 = false;
  local_30 = 0;
  addr._6_2_ = 0;
  data._4_4_ = 1;
  args_found = 0;
  port = 0;
  for (rc = 1; rc < (int)argv_local; rc = rc + 1) {
    if (*_j[rc] == '-') {
      if (_j[rc][1] == 'p') {
        local_30 = atoi(_j[rc] + 2);
        printf("Selecting port %d\n",(ulong)local_30);
      }
      else if (_j[rc][1] == 'n') {
        iVar5 = atoi(_j[rc] + 2);
        addr._6_2_ = (ushort)iVar5;
        printf("Selecting node %d\n",(ulong)addr._6_2_);
      }
      else if (_j[rc][1] == 'd') {
        bVar1 = true;
      }
    }
    else {
      if (port == 0) {
        _data1 = strtoull(_j[rc],(char **)0x0,0x10);
      }
      else if ((port == 1) && (bVar13)) {
        uVar9 = strtoul(_j[rc],(char **)0x0,0x10);
        data._0_4_ = __bswap_32((__uint32_t)uVar9);
      }
      else if ((port != 1) || (bVar13)) {
        if ((bVar13) || ((int)data._4_4_ <= args_found)) {
          fprintf(_stderr,"Warning: extra parameter: %s\n",_j[rc]);
        }
        else {
          uVar9 = strtoul(_j[rc],(char **)0x0,0x10);
          _Var6 = __bswap_32((__uint32_t)uVar9);
          *(__uint32_t *)((long)_isBroadcast + (long)args_found * 4) = _Var6;
          args_found = args_found + 1;
        }
      }
      else {
        uVar9 = strtoul(_j[rc],(char **)0x0,10);
        data._4_4_ = (uint)uVar9;
        _isBroadcast = (quadlet_t **)calloc(4,(long)(int)data._4_4_);
        if (_isBroadcast == (quadlet_t **)0x0) {
          fprintf(_stderr,"Failed to allocate memory for %d quadlets",(ulong)data._4_4_);
          exit(-1);
        }
      }
      port = port + 1;
    }
  }
  if (port < 1) {
    if (bVar13) {
      printf("Usage: %s [-pP] [-nN] <address in hex> [value to write in hex]\n",*_j);
    }
    else {
      printf("Usage: %s [-pP] [-nN] <address in hex> <size in quadlets> [write data quadlets in hex]\n"
             ,*_j);
    }
    printf("       where P = port number, N = node number\n");
    exit(0);
  }
  handle = (raw1394handle_t)raw1394_new_handle();
  if (handle == (raw1394handle_t)0x0) {
    fprintf(_stderr,"**** Error: could not open 1394 handle\n");
    exit(-1);
  }
  raw1394_set_bus_reset_handler(handle,reset_handler);
  uStack_2c = raw1394_get_port_info(handle,0,0);
  if ((int)uStack_2c < 0) {
    fprintf(_stderr,"**** Error: could not get port info\n");
    exit(-1);
  }
  if ((-1 < (int)local_30) && ((int)local_30 < (int)uStack_2c)) {
    nports = raw1394_set_port(handle,local_30);
    if (nports != 0) {
      fprintf(_stderr,"**** Error setting port %d\n",(ulong)local_30);
      exit(-1);
    }
    uVar3 = raw1394_get_local_id(handle);
    if (bVar1) {
      uVar10 = raw1394_get_libversion();
      printf("libraw1394_version = %s  local_node_id = %x\n",uVar10,(ulong)uVar3);
    }
    uVar7 = raw1394_get_nodecount(handle);
    if (addr._6_2_ == 0x3f) {
      bVar2 = true;
      printf("**** Warning: Broadcasting message \n");
      printf("     Address should be larger than CSR_CONFIG_ROM_END(0x%llx)\n",0xfffff0000800);
    }
    else if ((int)uVar7 <= (int)(uint)addr._6_2_) {
      fprintf(_stderr,"**** Error: node %d does not exist (num nodes = %d)\n",(ulong)addr._6_2_,
              (ulong)uVar7);
      exit(-1);
    }
    sVar4 = (uVar3 & 0xffc0) + addr._6_2_;
    if (((bVar13) && (port == 1)) || ((!bVar13 && (port < 3)))) {
      if (bVar2) {
        fprintf(_stderr,"**** Error: broadcast read NOT supported on node %d (num nodes = %d)\n",
                (ulong)addr._6_2_,(ulong)uVar7);
      }
      nports = raw1394_read(handle,sVar4,_data1,(long)(int)(data._4_4_ << 2),_isBroadcast);
      if (nports == 0) {
        for (args_found = 0; args_found < (int)data._4_4_; args_found = args_found + 1) {
          _Var6 = __bswap_32(*(__uint32_t *)((long)_isBroadcast + (long)args_found * 4));
          printf("0x%08X\n",(ulong)_Var6);
        }
      }
    }
    else if (bVar2) {
      nports = raw1394_start_write(handle,sVar4,_data1,(long)(int)(data._4_4_ << 2),_isBroadcast,0xb
                                  );
    }
    else {
      nports = raw1394_write(handle,sVar4,_data1,(long)(int)(data._4_4_ << 2),_isBroadcast);
    }
    __stream = _stderr;
    if (nports != 0) {
      puVar11 = (uint *)__errno_location();
      uVar7 = *puVar11;
      piVar12 = __errno_location();
      pcVar8 = strerror(*piVar12);
      fprintf(__stream,"**** Error: errno = %d %s \n",(ulong)uVar7,pcVar8);
    }
    if (_isBroadcast != &data) {
      free(_isBroadcast);
    }
    raw1394_destroy_handle(handle);
    return 0;
  }
  fprintf(_stderr,"**** Error: port %d does not exist (num ports = %d)\n",(ulong)local_30,
          (ulong)uStack_2c);
  exit(-1);
}

Assistant:

int main(int argc, char** argv)
{
    int i, j, rc, args_found;
    int nports;
    int port;
    nodeid_t node;
    nodeaddr_t addr;
    int size;
    quadlet_t data1;
    quadlet_t *data = &data1;

    signal(SIGINT, signal_handler);

    int isQuad1394 = (strstr(argv[0], "quad1394") != 0);
    int isBroadcast = 0;
    int isDebug = 0;

    port = 0;
    node = 0;
    size = 1;
    j = 0;
    args_found = 0;
    for (i = 1; i < argc; i++) {
        if (argv[i][0] == '-') {
            if (argv[i][1] == 'p') {
                port = atoi(argv[i]+2);
                printf("Selecting port %d\n", port);
            }
            else if (argv[i][1] == 'n') {
                node = atoi(argv[i]+2);
                printf("Selecting node %d\n", node);
            }
            else if (argv[i][1] == 'd') {
                isDebug = 1;
            }
        }
        else {
            if (args_found == 0)
                addr = strtoull(argv[i], 0, 16);
            else if ((args_found == 1) && (isQuad1394))
                data1 = bswap_32(strtoul(argv[i], 0, 16));
            else if ((args_found == 1) && (!isQuad1394)) {
                size = strtoul(argv[i], 0, 10);
                /* Allocate data array, initializing contents to 0 */
                data = (quadlet_t *) calloc(sizeof(quadlet_t), size);
                if (!data) {
                    fprintf(stderr, "Failed to allocate memory for %d quadlets", size);
                    exit(-1);
                }
            }
            else if (!isQuad1394 && (j < size))
                data[j++] = bswap_32(strtoul(argv[i], 0, 16));
            else
                fprintf(stderr, "Warning: extra parameter: %s\n", argv[i]);

            args_found++;
        }
    }

    if (args_found < 1) {
        if (isQuad1394)
            printf("Usage: %s [-pP] [-nN] <address in hex> [value to write in hex]\n", argv[0]);
        else
            printf("Usage: %s [-pP] [-nN] <address in hex> <size in quadlets> [write data quadlets in hex]\n", argv[0]);
        printf("       where P = port number, N = node number\n");
        exit(0);
    }

    /* get handle to device and check for errors */
    handle = raw1394_new_handle();
    if (handle == NULL) {
        fprintf(stderr, "**** Error: could not open 1394 handle\n");
        exit(-1);
    }

    /* set the bus reset handler */
    raw1394_set_bus_reset_handler(handle, reset_handler);

    /* get number of ports and check for errors */
    nports = raw1394_get_port_info(handle, NULL, 0);
    if (nports < 0) {
        fprintf(stderr, "**** Error: could not get port info\n");
        exit(-1);
    }
    if ((port < 0) || (port >= nports)) {
        fprintf(stderr, "**** Error: port %d does not exist (num ports = %d)\n", port, nports);
        exit(-1);
    }

    /* set handle to current port and skip errors */
    rc = raw1394_set_port(handle, port);
    if (rc) {
        fprintf(stderr, "**** Error setting port %d\n", port);
        exit(-1);
    }

    // get local id and printf libraw1394 version & local_node_id for debugging
    nodeid_t id = raw1394_get_local_id(handle);
    if (isDebug) {
        printf("libraw1394_version = %s  local_node_id = %x\n", raw1394_get_libversion(), id);
    }

    /* get number of nodes connected to current port/handle */
    int nnodes = raw1394_get_nodecount(handle);
    //    bool
    if (node == 63) {
        isBroadcast = 1;
        printf("**** Warning: Broadcasting message \n");
        printf("     Address should be larger than CSR_CONFIG_ROM_END(0x%llx)\n", CSR_CONFIG_ROM_END + CSR_REGISTER_BASE);
    } else if ((node < 0) || (node >= nnodes)) {
        fprintf(stderr, "**** Error: node %d does not exist (num nodes = %d)\n", node, nnodes);
        exit(-1);
    }
    nodeid_t target_node = (id & 0xFFC0)+node;

    /* determine whether to read or write based on args_found */
    if ((isQuad1394 && (args_found == 1)) ||
            (!isQuad1394 && (args_found <= 2)))
    {
        if (isBroadcast) {
            fprintf(stderr, "**** Error: broadcast read NOT supported on node %d (num nodes = %d)\n", node, nnodes);
        }

        /* read the data block and print out the values */
        rc = raw1394_read(handle, target_node, addr, size*4, data);
        if (!rc) {
            for (j=0; j<size; j++)
                printf("0x%08X\n", bswap_32(data[j]));
        }
    } else {
        /* for write */
        if (isBroadcast) {
            // broadcast, no ack is expected
            rc = raw1394_start_write(handle, target_node, addr, size*4, data, 11);
        } else {
            // asynchronous write
            rc = raw1394_write(handle, target_node, addr, size*4, data);
        }
    }
    if (rc) {
        fprintf(stderr, "**** Error: errno = %d %s \n", errno, strerror(errno));
    }

    // Free memory if it was dynamically allocated
    if (data != &data1)
        free(data);

    raw1394_destroy_handle(handle);
    return 0;
}